

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SizeTestInstance *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  long lVar1;
  TestStatus *pTVar2;
  undefined8 obj;
  undefined8 commandBuffer;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkCommandPool VVar5;
  deUint32 queueFamilyIndex;
  int iVar6;
  DeviceInterface *deviceInterface;
  VkDevice device;
  const_iterator cVar7;
  VkDescriptorSetLayout descriptorSetLayout;
  undefined4 extraout_var_00;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  IVec3 expectedSize;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  long *local_310;
  long local_308;
  long local_300;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  IVec3 resultSize;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  TestStatus *local_2a0;
  VkQueue local_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  VkDescriptorSet descriptorSet;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_260;
  VkPipeline local_248;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_240;
  VkShaderModule local_228;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_220;
  VkDevice *local_208 [2];
  VkDevice local_1f8 [2];
  IVec3 size;
  VkDevice local_1d8;
  VkCommandPool VStack_1d0;
  ios_base local_178 [272];
  VkBufferMemoryBarrier shaderWriteBarrier;
  undefined4 extraout_var;
  
  local_2a0 = __return_storage_ptr__;
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_298 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             (((this->m_resultBuffer).
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
              ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,0,this->m_resultBufferSizeBytes);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  local_338._0_8_ = &local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"comp","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)local_338);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&size,deviceInterface,device,
             *(ProgramBinary **)(cVar7._M_node + 2),0);
  DStack_220.m_device = local_1d8;
  DStack_220.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_228.m_internal._0_4_ = size.m_data[0];
  local_228.m_internal._4_4_ = size.m_data[1];
  DStack_220.m_deviceIface = stack0xfffffffffffffe20;
  size.m_data[0] = 0;
  size.m_data[1] = 0;
  stack0xfffffffffffffe20 = (DeviceInterface *)0x0;
  local_1d8 = (VkDevice)0x0;
  VStack_1d0.m_internal = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ != &local_328) {
    operator_delete((void *)local_338._0_8_,local_328._M_allocated_capacity + 1);
  }
  descriptorSetLayout.m_internal._0_4_ = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  descriptorSetLayout.m_internal._4_4_ = extraout_var;
  iVar6 = (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  descriptorSet.m_internal = CONCAT44(extraout_var_00,iVar6);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&size,deviceInterface,device,
                     descriptorSetLayout);
  local_328._M_allocated_capacity = (size_type)local_1d8;
  local_328._8_8_ = VStack_1d0.m_internal;
  local_338._0_4_ = size.m_data[0];
  local_338._4_4_ = size.m_data[1];
  local_338._8_8_ = stack0xfffffffffffffe20;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&size,deviceInterface,device,
                      (VkPipelineLayout)size.m_data._0_8_,local_228);
  DStack_240.m_device = local_1d8;
  DStack_240.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  local_248.m_internal._0_4_ = size.m_data[0];
  local_248.m_internal._4_4_ = size.m_data[1];
  DStack_240.m_deviceIface = stack0xfffffffffffffe20;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&size,deviceInterface,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  obj = size.m_data._0_8_;
  DStack_260.m_device = local_1d8;
  DStack_260.m_allocator = (VkAllocationCallbacks *)VStack_1d0.m_internal;
  DStack_260.m_deviceIface = stack0xfffffffffffffe20;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&size,deviceInterface,device,
             (VkCommandPool)size.m_data._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar5.m_internal = VStack_1d0.m_internal;
  pVVar4 = local_1d8;
  pDVar3 = stack0xfffffffffffffe20;
  commandBuffer = size.m_data._0_8_;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)size.m_data._0_8_);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,commandBuffer,1,local_248.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,commandBuffer,1,local_338._0_8_,0,1,&descriptorSet,0,0);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,commandBuffer);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])(deviceInterface,commandBuffer,1,1,1);
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,commandBuffer,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(deviceInterface,device,local_298,(VkCommandBuffer)commandBuffer);
  lVar1 = (long)(((this->m_resultBuffer).
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(lVar1 + 8),
             *(VkDeviceSize *)(lVar1 + 0x10),this->m_resultBufferSizeBytes);
  resultSize.m_data._0_8_ = *(undefined8 *)*(int **)(lVar1 + 0x18);
  resultSize.m_data[2] = (*(int **)(lVar1 + 0x18))[2];
  Texture::size(&this->m_texture);
  pTVar2 = local_2a0;
  expectedSize.m_data[1] = size.m_data[1];
  expectedSize.m_data[0] = size.m_data[0];
  switch((this->m_texture).m_type) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_BUFFER:
    expectedSize.m_data[1] = 0;
    expectedSize.m_data[2] = 0;
    break;
  case IMAGE_TYPE_1D_ARRAY:
  case IMAGE_TYPE_2D:
  case IMAGE_TYPE_CUBE:
    expectedSize.m_data[2] = 0;
    break;
  case IMAGE_TYPE_2D_ARRAY:
  case IMAGE_TYPE_3D:
    expectedSize.m_data[2] = size.m_data[2];
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    expectedSize.m_data[2] = size.m_data[2] / 6;
    break;
  default:
    expectedSize.m_data[2] = 0;
    expectedSize.m_data[0] = 0;
    expectedSize.m_data[1] = 0;
  }
  if (resultSize.m_data[0] == expectedSize.m_data[0]) {
    uVar13 = 0;
    do {
      uVar8 = uVar13;
      if (uVar8 == 2) {
        uVar8 = 2;
        break;
      }
      uVar13 = uVar8 + 1;
    } while (resultSize.m_data[uVar8 + 1] == expectedSize.m_data[uVar8 + 1]);
    if (uVar8 < 2) goto LAB_00751a1f;
    size.m_data._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&size,"Passed","");
    pTVar2->m_code = QP_TEST_RESULT_PASS;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,size.m_data._0_8_,
               (long)&stack0xfffffffffffffe20->_vptr_DeviceInterface + size.m_data._0_8_);
    local_1f8[0] = local_1d8;
    local_208[0] = (VkDevice *)size.m_data._0_8_;
    if ((VkDevice *)size.m_data._0_8_ == &local_1d8) goto LAB_00751d96;
  }
  else {
LAB_00751a1f:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&size);
    tcu::operator<<((ostream *)&size,&expectedSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&size);
    std::ios_base::~ios_base(local_178);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xb67f09);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_280 = *plVar11;
      lStack_278 = plVar9[3];
      local_290 = &local_280;
    }
    else {
      local_280 = *plVar11;
      local_290 = (long *)*plVar9;
    }
    local_288 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_290);
    puVar12 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar12) {
      local_2d0 = *puVar12;
      lStack_2c8 = plVar9[3];
      local_2e0 = &local_2d0;
    }
    else {
      local_2d0 = *puVar12;
      local_2e0 = (ulong *)*plVar9;
    }
    local_2d8 = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&size);
    tcu::operator<<((ostream *)&size,&resultSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&size);
    std::ios_base::~ios_base(local_178);
    uVar13 = 0xf;
    if (local_2e0 != &local_2d0) {
      uVar13 = local_2d0;
    }
    if (uVar13 < (ulong)(local_2b8 + local_2d8)) {
      uVar13 = 0xf;
      if (local_2c0 != local_2b0) {
        uVar13 = local_2b0[0];
      }
      if (uVar13 < (ulong)(local_2b8 + local_2d8)) goto LAB_00751bf0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2e0);
    }
    else {
LAB_00751bf0:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2c0);
    }
    local_310 = &local_300;
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_300 = *plVar9;
      uStack_2f8 = *(undefined4 *)(puVar10 + 3);
      uStack_2f4 = *(undefined4 *)((long)puVar10 + 0x1c);
    }
    else {
      local_300 = *plVar9;
      local_310 = (long *)*puVar10;
    }
    local_308 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)plVar9 = 0;
    pTVar2->m_code = QP_TEST_RESULT_FAIL;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_310,
               (undefined1 *)(local_308 + (long)local_310));
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if (local_2c0 != local_2b0) {
      operator_delete(local_2c0,local_2b0[0] + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_208[0] == local_1f8) goto LAB_00751d96;
  }
  operator_delete(local_208[0],(ulong)(local_1f8[0] + 1));
LAB_00751d96:
  if (commandBuffer != 0) {
    size.m_data._0_8_ = commandBuffer;
    (*pDVar3->_vptr_DeviceInterface[0x48])(pDVar3,pVVar4,VVar5.m_internal,1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_260,(VkCommandPool)obj);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_240,local_248);
  }
  if ((pointer)local_338._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_338 + 8),
               (VkPipelineLayout)local_338._0_8_);
  }
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_220,local_228);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus SizeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create memory barriers.

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
		m_resultBuffer->get(), 0ull, m_resultBufferSizeBytes);

	// Create the pipeline.

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const VkDescriptorSet descriptorSet = getDescriptorSet();

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

	commandBeforeCompute(*cmdBuffer);
	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Compare the result.

	const Allocation& bufferAlloc = m_resultBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAlloc.getMemory(), bufferAlloc.getOffset(), m_resultBufferSizeBytes);

	const tcu::IVec3 resultSize = readIVec3(bufferAlloc.getHostPtr());
	const tcu::IVec3 expectedSize = getExpectedImageSizeResult(m_texture);

	if (resultSize != expectedSize)
		return tcu::TestStatus::fail("Incorrect imageSize(): expected " + de::toString(expectedSize) + " but got " + de::toString(resultSize));
	else
		return tcu::TestStatus::pass("Passed");
}